

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicInequivalencyNonSetTest_Test::TestBody
          (MessageDifferencerTest_BasicInequivalencyNonSetTest_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestAllTypes msg2;
  TestAllTypes msg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6d0;
  AssertHelper local_6c8;
  internal local_6c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6b8;
  string local_6b0;
  TestAllTypes local_690;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_690,(Arena *)0x0);
  local_350.field_0._impl_.optional_int32_ = -1;
  local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       local_350.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  bVar1 = util::MessageDifferencer::Equivalent(&local_350.super_Message,&local_690.super_Message);
  local_6c0[0] = (internal)!bVar1;
  local_6b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b0,local_6c0,
               (AssertionResult *)"util::MessageDifferencer::Equivalent(msg1, msg2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x2ef,local_6b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6c8,(Message *)&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    if (local_6d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6d0._M_head_impl + 8))();
    }
  }
  if (local_6b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_6b8,local_6b8);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicInequivalencyNonSetTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  msg1.set_optional_int32(-1);

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
}